

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.hpp
# Opt level: O0

double __thiscall
gl4cts::ShaderSubroutine::Utils::vec4<unsigned_int>::log(vec4<unsigned_int> *this,double __x)

{
  MessageBuilder *pMVar1;
  MessageBuilder *in_RSI;
  double extraout_XMM0_Qa;
  MessageBuilder *message_local;
  vec4<unsigned_int> *this_local;
  
  pMVar1 = tcu::MessageBuilder::operator<<(in_RSI,(char (*) [3])0x2b3d303);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_x);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_y);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_z);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_w);
  tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x29ea7cd);
  return extraout_XMM0_Qa;
}

Assistant:

void log(tcu::MessageBuilder& message) const
		{
			message << "[ " << m_x << ", " << m_y << ", " << m_z << ", " << m_w << " ]";
		}